

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O2

Gia_Man_t * Str_NtkToGia(Gia_Man_t *pGia,Str_Ntk_t *p)

{
  int iVar1;
  int iData0;
  int iVar2;
  uint uVar3;
  Gia_Man_t *p_00;
  char *pcVar4;
  Str_Obj_t *pSVar5;
  Gia_Man_t *pGVar6;
  uint uVar7;
  Str_Obj_t *pObj;
  
  if (pGia->pMuxes != (uint *)0x0) {
    __assert_fail("pGia->pMuxes == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaStr.c"
                  ,0xaf,"Gia_Man_t *Str_NtkToGia(Gia_Man_t *, Str_Ntk_t *)");
  }
  p_00 = Gia_ManStart((pGia->nObjs * 3) / 2);
  pcVar4 = Abc_UtilStrsav(pGia->pName);
  p_00->pName = pcVar4;
  pcVar4 = Abc_UtilStrsav(pGia->pSpec);
  p_00->pSpec = pcVar4;
  Gia_ManHashStart(p_00);
  pSVar5 = p->pObjs;
  pObj = pSVar5;
  do {
    if (p->nObjs <= (int)((ulong)((long)pObj - (long)pSVar5) >> 4)) {
      Gia_ManHashStop(p_00);
      Gia_ManSetRegNum(p_00,pGia->nRegs);
      pGVar6 = Gia_ManCleanup(p_00);
      Gia_ManStop(p_00);
      return pGVar6;
    }
    uVar3 = *(uint *)pObj;
    switch(uVar3 & 0xf) {
    case 1:
      iVar2 = 0;
      break;
    case 2:
      iVar2 = Gia_ManAppendCi(p_00);
      break;
    case 3:
      pObj->iCopy = 1;
      iVar2 = 1;
      for (uVar7 = 0; uVar7 < uVar3 >> 4; uVar7 = uVar7 + 1) {
        iVar1 = Str_ObjFaninCopy(p,pObj,uVar7);
        iVar2 = Gia_ManHashAnd(p_00,iVar2,iVar1);
        pObj->iCopy = iVar2;
        uVar3 = *(uint *)pObj;
      }
      goto LAB_00602cac;
    case 4:
      pObj->iCopy = 0;
      iVar2 = 0;
      for (uVar7 = 0; uVar7 < uVar3 >> 4; uVar7 = uVar7 + 1) {
        iVar1 = Str_ObjFaninCopy(p,pObj,uVar7);
        iVar2 = Gia_ManHashXor(p_00,iVar2,iVar1);
        pObj->iCopy = iVar2;
        uVar3 = *(uint *)pObj;
      }
      goto LAB_00602cac;
    case 5:
      iVar2 = Str_ObjFaninCopy(p,pObj,2);
      iVar1 = Str_ObjFaninCopy(p,pObj,1);
      iData0 = Str_ObjFaninCopy(p,pObj,0);
      iVar2 = Gia_ManHashMux(p_00,iVar2,iVar1,iData0);
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaStr.c"
                    ,0xca,"Gia_Man_t *Str_NtkToGia(Gia_Man_t *, Str_Ntk_t *)");
    case 7:
      iVar2 = Str_ObjFaninCopy(p,pObj,0);
      iVar2 = Gia_ManAppendCo(p_00,iVar2);
    }
    pObj->iCopy = iVar2;
LAB_00602cac:
    pObj = pObj + 1;
    pSVar5 = p->pObjs;
  } while( true );
}

Assistant:

Gia_Man_t * Str_NtkToGia( Gia_Man_t * pGia, Str_Ntk_t * p )
{
    Gia_Man_t * pNew, * pTemp;
    Str_Obj_t * pObj; int k;
    assert( pGia->pMuxes == NULL );
    pNew = Gia_ManStart( 3 * Gia_ManObjNum(pGia) / 2 );
    pNew->pName = Abc_UtilStrsav( pGia->pName );
    pNew->pSpec = Abc_UtilStrsav( pGia->pSpec );
    Gia_ManHashStart( pNew );
    Str_NtkManForEachObj( p, pObj )
    {
        if ( pObj->Type == STR_PI )
            pObj->iCopy = Gia_ManAppendCi( pNew );
        else if ( pObj->Type == STR_AND )
        {
            pObj->iCopy = 1;
            for ( k = 0; k < (int)pObj->nFanins; k++ )
                pObj->iCopy = Gia_ManHashAnd( pNew, pObj->iCopy, Str_ObjFaninCopy(p, pObj, k) );
        }
        else if ( pObj->Type == STR_XOR )
        {
            pObj->iCopy = 0;
            for ( k = 0; k < (int)pObj->nFanins; k++ )
                pObj->iCopy = Gia_ManHashXor( pNew, pObj->iCopy, Str_ObjFaninCopy(p, pObj, k) );
        }
        else if ( pObj->Type == STR_MUX )
            pObj->iCopy = Gia_ManHashMux( pNew, Str_ObjFaninCopy(p, pObj, 2), Str_ObjFaninCopy(p, pObj, 1), Str_ObjFaninCopy(p, pObj, 0) );
        else if ( pObj->Type == STR_PO )
            pObj->iCopy = Gia_ManAppendCo( pNew, Str_ObjFaninCopy(p, pObj, 0) );
        else if ( pObj->Type == STR_CONST0 )
            pObj->iCopy = 0;
        else assert( 0 );
    }
    Gia_ManHashStop( pNew );
//    assert( Gia_ManObjNum(pNew) <= Gia_ManObjNum(pGia) );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(pGia) );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}